

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.hpp
# Opt level: O1

BigInt<unsigned_int,_unsigned_long> * __thiscall
scp::BigInt<unsigned_int,_unsigned_long>::operator+=
          (BigInt<unsigned_int,_unsigned_long> *this,BigInt<unsigned_int,_unsigned_long> *x)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  uint *puVar4;
  bool bVar5;
  long lVar6;
  uint in_EAX;
  pointer puVar7;
  uint *puVar8;
  ulong uVar9;
  uint *puVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  pointer puVar14;
  long lVar15;
  long lVar16;
  undefined8 uStack_18;
  
  puVar2 = (this->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = (this->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 == puVar7) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this->_values,&x->_values);
    this->_positive = x->_positive;
  }
  else {
    puVar14 = (x->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar3 = (x->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar14 != puVar3) {
      if (this->_positive == x->_positive) {
        uVar9 = (long)puVar7 - (long)puVar2 >> 2;
        uVar12 = (long)puVar3 - (long)puVar14 >> 2;
        uVar13 = uVar12;
        if (uVar12 < uVar9) {
          uVar13 = uVar9;
        }
        puVar7 = puVar14;
        if (uVar9 < uVar12) {
          puVar7 = puVar2;
          uVar12 = uVar9;
          puVar2 = puVar14;
        }
        lVar11 = uVar13 * 4;
        lVar6 = 0;
        puVar14 = puVar2;
        do {
          lVar16 = lVar6;
          puVar14 = puVar14 + -1;
          lVar15 = lVar11 + uVar12 * -4 + lVar16;
          if (lVar15 == 0) {
            if (lVar11 + lVar16 != 0) goto LAB_0010535b;
            goto LAB_0010538e;
          }
          lVar6 = lVar16 + -4;
        } while (puVar14[uVar13] == 0xffffffff);
        if ((lVar15 == 0) && (lVar11 + lVar16 + -4 != -4)) {
LAB_0010535b:
          lVar11 = lVar11 + lVar16;
          while( true ) {
            lVar11 = lVar11 + -4;
            uVar12 = (ulong)*(uint *)((long)puVar2 + lVar11) +
                     (ulong)*(uint *)((long)puVar7 + lVar11);
            if (uVar12 >> 0x20 != 0) break;
            if ((lVar11 == 0) || (uVar12 != 0xffffffff)) goto LAB_0010538e;
          }
          uVar13 = uVar13 + 1;
        }
LAB_0010538e:
        uStack_18 = (ulong)in_EAX;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  (&this->_values,uVar13,(value_type_conflict *)((long)&uStack_18 + 4));
        puVar10 = (x->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar4 = (x->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        puVar8 = (this->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (puVar10 == puVar4) {
          bVar5 = true;
        }
        else {
          uVar12 = 0;
          do {
            uVar13 = (ulong)*puVar8 + *puVar10 + uVar12;
            *puVar8 = (uint)uVar13;
            uVar12 = uVar13 >> 0x20;
            puVar10 = puVar10 + 1;
            puVar8 = puVar8 + 1;
          } while (puVar10 != puVar4);
          bVar5 = uVar13 >> 0x20 == 0;
        }
        if (!bVar5) {
          do {
            *puVar8 = *puVar8 + 1;
            uVar1 = *puVar8;
            puVar8 = puVar8 + 1;
          } while (uVar1 == 0);
        }
      }
      else {
        this->_positive = (bool)(this->_positive ^ 1);
        operator-=(this,x);
        this->_positive = (bool)(this->_positive ^ 1);
      }
    }
  }
  return this;
}

Assistant:

constexpr BigInt<TBase, TBuffer>& BigInt<TBase, TBuffer>::operator+=(const BigInt<TBase, TBuffer>& x)
	{
		// If this == 0, return x

		if (_values.empty())
		{
			_values = x._values;
			_positive = x._positive;
			return *this;
		}

		// If x == 0, return this

		if (x._values.empty())
		{
			return *this;
		}

		// If this and x are not the same sign, perform a substraction

		if (_positive != x._positive)
		{
			_positive = !_positive;
			*this -= x;
			_positive = !_positive;
			return *this;
		}

		// Identifying the "biggest" number (the one with the most "digits")

		uint64_t sizeBig;
		uint64_t sizeSmall;
		const TBase* itBigBeg;
		const TBase* itSmallBeg;
		if (_values.size() >= x._values.size())
		{
			sizeBig = _values.size();
			sizeSmall = x._values.size();
			itBigBeg = _values.data();
			itSmallBeg = x._values.data();
		}
		else
		{
			sizeBig = x._values.size();
			sizeSmall = _values.size();
			itBigBeg = x._values.data();
			itSmallBeg = _values.data();
		}

		// Finding if an additional digit is necessary

		const TBase* itBig = itBigBeg + sizeBig - 1;
		const TBase* itSmall = itSmallBeg + sizeBig - 1;
		const TBase* itSmallEnd = itSmallBeg + sizeSmall - 1;
		while (itSmall != itSmallEnd && *itBig == _baseMax)
		{
			--itSmall;
			--itBig;
		}

		TBuffer buffer = _baseMax;
		uint64_t newSize = sizeBig;

		if (itSmall == itSmallEnd)
		{
			itSmallEnd = itSmallBeg - 1;
			while (itSmall != itSmallEnd && buffer == _baseMax)
			{
				buffer = static_cast<TBuffer>(*itSmall) + static_cast<TBuffer>(*itBig);
				if (buffer > _baseMax)
				{
					++newSize;
					break;
				}

				--itSmall;
				--itBig;
			}
		}

		// Compute the addition

		_values.resize(newSize, 0);
		itSmall = x._values.data();
		sizeSmall = x._values.size();

		itSmallEnd = itSmall + sizeSmall;

		TBase* itOut = _values.data();
		buffer = 0;
		while (itSmall != itSmallEnd)
		{
			buffer += static_cast<TBuffer>(*itSmall) + static_cast<TBuffer>(*itOut);
			*itOut = buffer & _bufferLowFilter;
			buffer >>= _baseBitSize;

			++itSmall;
			++itOut;
		}

		while (buffer != 0)
		{
			buffer += *itOut;
			*itOut = buffer & _bufferLowFilter;
			buffer >>= _baseBitSize;

			++itOut;
		}

		return *this;
	}